

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

file_info * re_get_entry(iso9660 *iso9660)

{
  file_info *pfVar1;
  file_info *pfVar2;
  
  pfVar1 = (iso9660->re_files).first;
  if (pfVar1 != (file_info *)0x0) {
    pfVar2 = pfVar1->re_next;
    (iso9660->re_files).first = pfVar2;
    if (pfVar2 == (file_info *)0x0) {
      (iso9660->re_files).last = &(iso9660->re_files).first;
      return pfVar1;
    }
  }
  return pfVar1;
}

Assistant:

static inline struct file_info *
re_get_entry(struct iso9660 *iso9660)
{
	struct file_info *file;

	if ((file = iso9660->re_files.first) != NULL) {
		iso9660->re_files.first = file->re_next;
		if (iso9660->re_files.first == NULL)
			iso9660->re_files.last =
			    &(iso9660->re_files.first);
	}
	return (file);
}